

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_portable_encoder.h
# Opt level: O0

bool __thiscall
draco::
MeshPredictionSchemeTexCoordsPortableEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
::SetParentAttribute
          (MeshPredictionSchemeTexCoordsPortableEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           *this,PointAttribute *att)

{
  uint8_t uVar1;
  Type TVar2;
  PointAttribute *in_RSI;
  long in_RDI;
  undefined1 local_1;
  
  TVar2 = GeometryAttribute::attribute_type(&in_RSI->super_GeometryAttribute);
  if (TVar2 == POSITION) {
    uVar1 = GeometryAttribute::num_components(&in_RSI->super_GeometryAttribute);
    if (uVar1 == '\x03') {
      MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
      ::SetPositionAttribute
                ((MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                  *)(in_RDI + 0x48),in_RSI);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SetParentAttribute(const PointAttribute *att) override {
    if (att->attribute_type() != GeometryAttribute::POSITION) {
      return false;  // Invalid attribute type.
    }
    if (att->num_components() != 3) {
      return false;  // Currently works only for 3 component positions.
    }
    predictor_.SetPositionAttribute(*att);
    return true;
  }